

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rtp.c
# Opt level: O0

int rtp_pkt_unpack(rtp_pkt_t *pkt)

{
  uint uVar1;
  int iVar2;
  uchar *plen;
  uchar *ptr;
  rtp_pkt_t *pkt_local;
  
  ptr = (uchar *)pkt;
  if (pkt != (rtp_pkt_t *)0x0) {
    pkt->b = (rtp_bits_t)((uint)pkt->b & 0xfffffffc | (int)(uint)pkt->data[0] >> 6);
    if (((uint)pkt->b & 3) == 2) {
      pkt->b = (rtp_bits_t)((uint)pkt->b & 0xfffffffb | ((int)(uint)pkt->data[0] >> 5 & 1U) << 2);
      pkt->b = (rtp_bits_t)((uint)pkt->b & 0xfffffff7 | ((int)(uint)pkt->data[0] >> 4 & 1U) << 3);
      pkt->b = (rtp_bits_t)((uint)pkt->b & 0xffffff0f | (pkt->data[0] & 0xf) << 4);
      pkt->b = (rtp_bits_t)((uint)pkt->b & 0xfffffeff | ((int)(uint)pkt->data[1] >> 7) << 8);
      pkt->b = (rtp_bits_t)((uint)pkt->b & 0xffff01ff | (pkt->data[1] & 0x7f) << 9);
      plen = pkt->data + 2;
      uVar1 = uint16_unpack__(&plen);
      *(uint *)ptr = *(uint *)ptr & 0xffff | uVar1 << 0x10;
      uVar1 = uint32_unpack__(&plen);
      *(ulong *)(ptr + 8) = (ulong)uVar1;
      plen = plen + 4;
      if ((*(long *)(ptr + 0x618) == 0) || (iVar2 = (**(code **)(ptr + 0x618))(ptr), iVar2 != 0)) {
        if ((*(uint *)ptr >> 2 & 1) == 0) {
          ptr[0x18] = '\0';
        }
        else {
          ptr[0x18] = ptr[*(long *)(ptr + 0x20) + 0x27];
        }
        *(ulong *)(ptr + 0x20) =
             *(long *)(ptr + 0x20) - (ulong)(*(int *)(ptr + 0x1c) + (*(uint *)ptr >> 4 & 0xf) * 4);
        if ((*(uint *)ptr >> 2 & 1) != 0) {
          *(long *)(ptr + 0x20) = *(long *)(ptr + 0x20) - (long)(int)(ptr[0x18] + 1);
        }
        pkt_local._4_4_ = 1;
      }
      else {
        pkt_local._4_4_ = 0;
      }
    }
    else {
      pkt_local._4_4_ = 0;
    }
    return pkt_local._4_4_;
  }
  __assert_fail("pkt != NULL","/workspace/llm4binary/github/license_c_cmakelists/wesen[P]poc/rtp.c",
                0xbc,"int rtp_pkt_unpack(rtp_pkt_t *)");
}

Assistant:

int rtp_pkt_unpack(rtp_pkt_t *pkt) {
  assert(pkt != NULL);
  
  /* v: 2 bits, p: 1 bit, x: 1 bit, cc: 4 bits */
  pkt->b.v  = (pkt->data[0] >> 6) & 0x3;
  /* check version */
  if (pkt->b.v != 2)
    return 0;
  pkt->b.p  = (pkt->data[0] >> 5) & 0x1;
  pkt->b.x  = (pkt->data[0] >> 4) & 0x1;
  pkt->b.cc = (pkt->data[0])      & 0xf;

  /* m: 1 bit, pt: 7 bits */
  pkt->b.m  = (pkt->data[1] >> 7) & 0x1;
  pkt->b.pt = (pkt->data[1])      & 0x7f;

  unsigned char *ptr = pkt->data + 2;
  /* seq: 16 bits */
  pkt->b.seq = UINT16_UNPACK(ptr);
  /* timestamp: 32 bits */
  pkt->timestamp = UINT32_UNPACK(ptr);
  /* ssrc: 32 bits, just ignore it */
  ptr += 4;

  if (pkt->unpack)
    if (!pkt->unpack(pkt))
      return 0;

  /*M
    If padding is used, then padding length is in last byte.
  **/
  if (pkt->b.p) {
    unsigned char *plen = pkt->data + pkt->length - 1;
    pkt->plen = *plen;
  } else {
    pkt->plen = 0;
  }
  

  /*M
    Ignore rest of packet for now.
  **/
  pkt->length -= pkt->hlen + pkt->b.cc * RTP_CSRC_SIZE;
  if (pkt->b.p)
    pkt->length -= pkt->plen + 1;

  return 1;
}